

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_defines.hpp
# Opt level: O3

string * chaiscript::Build_Info::version_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  undefined8 uVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  ulong uVar9;
  string *in_RDI;
  string __str_2;
  string __str_1;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_50._M_string_length = 1;
  local_50.field_2._M_allocated_capacity._0_2_ = 0x37;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_50,1,0,1,'.');
  paVar3 = &local_b0.field_2;
  local_b0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar8 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == paVar8) {
    local_b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
    local_b0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_b0._M_dataplus._M_p = (pointer)paVar3;
  }
  else {
    local_b0.field_2._M_allocated_capacity = paVar8->_M_allocated_capacity;
  }
  local_b0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar8;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  paVar8 = &local_70.field_2;
  local_70._M_string_length = 1;
  local_70.field_2._M_allocated_capacity._0_2_ = 0x30;
  uVar9 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    uVar9 = local_b0.field_2._M_allocated_capacity;
  }
  local_70._M_dataplus._M_p = (pointer)paVar8;
  if ((local_b0._M_string_length + 1 < 0x10) && (uVar9 < local_b0._M_string_length + 1)) {
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_70,0,0,local_b0._M_dataplus._M_p,local_b0._M_string_length);
  }
  else {
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_b0,paVar8->_M_local_buf,1);
  }
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(pbVar5->_M_dataplus)._M_p;
  paVar1 = &pbVar5->field_2;
  if (paVar6 == paVar1) {
    local_f0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_f0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
  }
  else {
    local_f0.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_f0._M_dataplus._M_p = (pointer)paVar6;
  }
  local_f0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar1;
  pbVar5->_M_string_length = 0;
  paVar1->_M_local_buf[0] = '\0';
  pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_replace_aux(&local_f0,local_f0._M_string_length,0,1,'.');
  paVar1 = &local_d0.field_2;
  local_d0._M_dataplus._M_p = (pbVar5->_M_dataplus)._M_p;
  paVar6 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p == paVar6) {
    local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
    local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
  }
  local_d0._M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
  pbVar5->_M_string_length = 0;
  (pbVar5->field_2)._M_local_buf[0] = '\0';
  paVar6 = &local_90.field_2;
  local_90._M_string_length = 1;
  local_90.field_2._M_allocated_capacity._0_2_ = 0x30;
  uVar7 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    uVar7 = local_d0.field_2._M_allocated_capacity;
  }
  local_90._M_dataplus._M_p = (pointer)paVar6;
  if ((local_d0._M_string_length + 1 < 0x10) && ((ulong)uVar7 < local_d0._M_string_length + 1)) {
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_90,0,0,local_d0._M_dataplus._M_p,local_d0._M_string_length);
  }
  else {
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             _M_append(&local_d0,paVar6->_M_local_buf,1);
  }
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  pcVar4 = (pbVar5->_M_dataplus)._M_p;
  paVar2 = &pbVar5->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar4 == paVar2) {
    uVar7 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
    (in_RDI->field_2)._M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar7;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = pcVar4;
    (in_RDI->field_2)._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  in_RDI->_M_string_length = pbVar5->_M_string_length;
  (pbVar5->_M_dataplus)._M_p = (pointer)paVar2;
  pbVar5->_M_string_length = 0;
  paVar2->_M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != paVar6) {
    operator_delete(local_90._M_dataplus._M_p,
                    CONCAT62(local_90.field_2._M_allocated_capacity._2_6_,
                             local_90.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar8) {
    operator_delete(local_70._M_dataplus._M_p,
                    CONCAT62(local_70.field_2._M_allocated_capacity._2_6_,
                             local_70.field_2._M_allocated_capacity._0_2_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != paVar3) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT62(local_50.field_2._M_allocated_capacity._2_6_,
                             local_50.field_2._M_allocated_capacity._0_2_) + 1);
  }
  return in_RDI;
}

Assistant:

[[nodiscard]] static std::string version() {
      return std::to_string(version_major()) + '.' + std::to_string(version_minor()) + '.' + std::to_string(version_patch());
    }